

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardIO.cpp
# Opt level: O2

uint BoardIO::GetFpgaVersionMajorFromStatus(uint32_t status)

{
  uint uVar1;
  
  if (status == 0) {
    uVar1 = 1;
  }
  else {
    if (-1 < (int)status) {
      return (uint)(0x3fffffff < status) * 3;
    }
    uVar1 = 2;
  }
  return uVar1;
}

Assistant:

unsigned int BoardIO::GetFpgaVersionMajorFromStatus(uint32_t status)
{
    // FPGA V1:  all bits are 0
    // FPGA V2:  bit 31 is 1
    // FPGA V3:  bits[31:30] are 01
    unsigned int fpga_ver = 0;
    if (status == 0)
        fpga_ver = 1;
    else if (status&0x80000000)
        fpga_ver = 2;
    else if ((status&0x40000000) == 0x40000000)
        fpga_ver = 3;

    return fpga_ver;
}